

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

FindInfo __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::find_first_non_full
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [11];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  undefined1 in_XMM1_Ba;
  char cVar24;
  undefined1 in_XMM1_Bb;
  char cVar25;
  undefined1 in_XMM1_Bc;
  char cVar26;
  undefined1 in_XMM1_Bd;
  char cVar27;
  undefined1 in_XMM1_Be;
  char cVar28;
  undefined1 in_XMM1_Bf;
  char cVar29;
  undefined1 in_XMM1_Bg;
  char cVar30;
  undefined1 in_XMM1_Bh;
  char cVar31;
  undefined1 in_XMM1_Bi;
  char cVar32;
  undefined1 in_XMM1_Bj;
  char cVar33;
  undefined1 in_XMM1_Bk;
  char cVar34;
  undefined1 in_XMM1_Bl;
  char cVar35;
  undefined1 in_XMM1_Bm;
  char cVar36;
  undefined1 in_XMM1_Bn;
  char cVar37;
  undefined1 in_XMM1_Bo;
  char cVar38;
  undefined1 in_XMM1_Bp;
  byte bVar39;
  FindInfo FVar40;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar22 = hashval >> 7 & uVar2;
  pcVar1 = this->ctrl_ + uVar22;
  iVar9 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                 CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
  iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                  CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
  iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                  CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
  iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                  CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
  cVar24 = -(*pcVar1 < (char)iVar9);
  cVar25 = -(pcVar1[1] < (char)((uint)iVar9 >> 8));
  cVar26 = -(pcVar1[2] < (char)((uint)iVar9 >> 0x10));
  cVar27 = -(pcVar1[3] < (char)((uint)iVar9 >> 0x18));
  cVar28 = -(pcVar1[4] < (char)iVar10);
  cVar29 = -(pcVar1[5] < (char)((uint)iVar10 >> 8));
  cVar30 = -(pcVar1[6] < (char)((uint)iVar10 >> 0x10));
  cVar31 = -(pcVar1[7] < (char)((uint)iVar10 >> 0x18));
  cVar32 = -(pcVar1[8] < (char)iVar11);
  cVar33 = -(pcVar1[9] < (char)((uint)iVar11 >> 8));
  cVar34 = -(pcVar1[10] < (char)((uint)iVar11 >> 0x10));
  cVar35 = -(pcVar1[0xb] < (char)((uint)iVar11 >> 0x18));
  cVar36 = -(pcVar1[0xc] < (char)iVar12);
  cVar37 = -(pcVar1[0xd] < (char)((uint)iVar12 >> 8));
  cVar38 = -(pcVar1[0xe] < (char)((uint)iVar12 >> 0x10));
  bVar39 = -(pcVar1[0xf] < (char)((uint)iVar12 >> 0x18));
  auVar5[1] = cVar25;
  auVar5[0] = cVar24;
  auVar5[2] = cVar26;
  auVar5[3] = cVar27;
  auVar5[4] = cVar28;
  auVar5[5] = cVar29;
  auVar5[6] = cVar30;
  auVar5[7] = cVar31;
  auVar5[8] = cVar32;
  auVar5[9] = cVar33;
  auVar5[10] = cVar34;
  auVar5[0xb] = cVar35;
  auVar5[0xc] = cVar36;
  auVar5[0xd] = cVar37;
  auVar5[0xe] = cVar38;
  auVar5[0xf] = bVar39;
  auVar6[1] = cVar25;
  auVar6[0] = cVar24;
  auVar6[2] = cVar26;
  auVar6[3] = cVar27;
  auVar6[4] = cVar28;
  auVar6[5] = cVar29;
  auVar6[6] = cVar30;
  auVar6[7] = cVar31;
  auVar6[8] = cVar32;
  auVar6[9] = cVar33;
  auVar6[10] = cVar34;
  auVar6[0xb] = cVar35;
  auVar6[0xc] = cVar36;
  auVar6[0xd] = cVar37;
  auVar6[0xe] = cVar38;
  auVar6[0xf] = bVar39;
  auVar19[1] = cVar27;
  auVar19[0] = cVar26;
  auVar19[2] = cVar28;
  auVar19[3] = cVar29;
  auVar19[4] = cVar30;
  auVar19[5] = cVar31;
  auVar19[6] = cVar32;
  auVar19[7] = cVar33;
  auVar19[8] = cVar34;
  auVar19[9] = cVar35;
  auVar19[10] = cVar36;
  auVar19[0xb] = cVar37;
  auVar19[0xc] = cVar38;
  auVar19[0xd] = bVar39;
  auVar17[1] = cVar28;
  auVar17[0] = cVar27;
  auVar17[2] = cVar29;
  auVar17[3] = cVar30;
  auVar17[4] = cVar31;
  auVar17[5] = cVar32;
  auVar17[6] = cVar33;
  auVar17[7] = cVar34;
  auVar17[8] = cVar35;
  auVar17[9] = cVar36;
  auVar17[10] = cVar37;
  auVar17[0xb] = cVar38;
  auVar17[0xc] = bVar39;
  auVar15[1] = cVar29;
  auVar15[0] = cVar28;
  auVar15[2] = cVar30;
  auVar15[3] = cVar31;
  auVar15[4] = cVar32;
  auVar15[5] = cVar33;
  auVar15[6] = cVar34;
  auVar15[7] = cVar35;
  auVar15[8] = cVar36;
  auVar15[9] = cVar37;
  auVar15[10] = cVar38;
  auVar15[0xb] = bVar39;
  auVar13[1] = cVar30;
  auVar13[0] = cVar29;
  auVar13[2] = cVar31;
  auVar13[3] = cVar32;
  auVar13[4] = cVar33;
  auVar13[5] = cVar34;
  auVar13[6] = cVar35;
  auVar13[7] = cVar36;
  auVar13[8] = cVar37;
  auVar13[9] = cVar38;
  auVar13[10] = bVar39;
  uVar4 = (ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB141(auVar19 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar17 >> 7,0) & 1) << 3 |
          (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
          (ushort)((byte)(CONCAT19(bVar39,CONCAT18(cVar38,CONCAT17(cVar37,CONCAT16(cVar36,CONCAT15(
                                                  cVar35,CONCAT14(cVar34,CONCAT13(cVar33,CONCAT12(
                                                  cVar32,CONCAT11(cVar31,cVar30))))))))) >> 7) & 1)
          << 6 | (ushort)((byte)(CONCAT18(bVar39,CONCAT17(cVar38,CONCAT16(cVar37,CONCAT15(cVar36,
                                                  CONCAT14(cVar35,CONCAT13(cVar34,CONCAT12(cVar33,
                                                  CONCAT11(cVar32,cVar31)))))))) >> 7) & 1) << 7 |
          (ushort)(bVar39 >> 7) << 0xf;
  uVar21 = 0;
  while( true ) {
    if (uVar4 != 0) {
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      FVar40.offset = uVar3 + uVar22 & uVar2;
      FVar40.probe_length = uVar21;
      return FVar40;
    }
    if (uVar2 <= uVar21) break;
    lVar23 = uVar22 + uVar21;
    uVar21 = uVar21 + 0x10;
    uVar22 = lVar23 + 0x10U & uVar2;
    pcVar1 = this->ctrl_ + uVar22;
    iVar9 = -(uint)(CONCAT13(cVar27,CONCAT12(cVar26,CONCAT11(cVar25,cVar24))) ==
                   CONCAT13(cVar27,CONCAT12(cVar26,CONCAT11(cVar25,cVar24))));
    iVar10 = -(uint)(CONCAT13(cVar31,CONCAT12(cVar30,CONCAT11(cVar29,cVar28))) ==
                    CONCAT13(cVar31,CONCAT12(cVar30,CONCAT11(cVar29,cVar28))));
    iVar11 = -(uint)(CONCAT13(cVar35,CONCAT12(cVar34,CONCAT11(cVar33,cVar32))) ==
                    CONCAT13(cVar35,CONCAT12(cVar34,CONCAT11(cVar33,cVar32))));
    iVar12 = -(uint)(CONCAT13(bVar39,CONCAT12(cVar38,CONCAT11(cVar37,cVar36))) ==
                    CONCAT13(bVar39,CONCAT12(cVar38,CONCAT11(cVar37,cVar36))));
    cVar24 = -(*pcVar1 < (char)iVar9);
    cVar25 = -(pcVar1[1] < (char)((uint)iVar9 >> 8));
    cVar26 = -(pcVar1[2] < (char)((uint)iVar9 >> 0x10));
    cVar27 = -(pcVar1[3] < (char)((uint)iVar9 >> 0x18));
    cVar28 = -(pcVar1[4] < (char)iVar10);
    cVar29 = -(pcVar1[5] < (char)((uint)iVar10 >> 8));
    cVar30 = -(pcVar1[6] < (char)((uint)iVar10 >> 0x10));
    cVar31 = -(pcVar1[7] < (char)((uint)iVar10 >> 0x18));
    cVar32 = -(pcVar1[8] < (char)iVar11);
    cVar33 = -(pcVar1[9] < (char)((uint)iVar11 >> 8));
    cVar34 = -(pcVar1[10] < (char)((uint)iVar11 >> 0x10));
    cVar35 = -(pcVar1[0xb] < (char)((uint)iVar11 >> 0x18));
    cVar36 = -(pcVar1[0xc] < (char)iVar12);
    cVar37 = -(pcVar1[0xd] < (char)((uint)iVar12 >> 8));
    cVar38 = -(pcVar1[0xe] < (char)((uint)iVar12 >> 0x10));
    bVar39 = -(pcVar1[0xf] < (char)((uint)iVar12 >> 0x18));
    auVar7[1] = cVar25;
    auVar7[0] = cVar24;
    auVar7[2] = cVar26;
    auVar7[3] = cVar27;
    auVar7[4] = cVar28;
    auVar7[5] = cVar29;
    auVar7[6] = cVar30;
    auVar7[7] = cVar31;
    auVar7[8] = cVar32;
    auVar7[9] = cVar33;
    auVar7[10] = cVar34;
    auVar7[0xb] = cVar35;
    auVar7[0xc] = cVar36;
    auVar7[0xd] = cVar37;
    auVar7[0xe] = cVar38;
    auVar7[0xf] = bVar39;
    auVar8[1] = cVar25;
    auVar8[0] = cVar24;
    auVar8[2] = cVar26;
    auVar8[3] = cVar27;
    auVar8[4] = cVar28;
    auVar8[5] = cVar29;
    auVar8[6] = cVar30;
    auVar8[7] = cVar31;
    auVar8[8] = cVar32;
    auVar8[9] = cVar33;
    auVar8[10] = cVar34;
    auVar8[0xb] = cVar35;
    auVar8[0xc] = cVar36;
    auVar8[0xd] = cVar37;
    auVar8[0xe] = cVar38;
    auVar8[0xf] = bVar39;
    auVar20[1] = cVar27;
    auVar20[0] = cVar26;
    auVar20[2] = cVar28;
    auVar20[3] = cVar29;
    auVar20[4] = cVar30;
    auVar20[5] = cVar31;
    auVar20[6] = cVar32;
    auVar20[7] = cVar33;
    auVar20[8] = cVar34;
    auVar20[9] = cVar35;
    auVar20[10] = cVar36;
    auVar20[0xb] = cVar37;
    auVar20[0xc] = cVar38;
    auVar20[0xd] = bVar39;
    auVar18[1] = cVar28;
    auVar18[0] = cVar27;
    auVar18[2] = cVar29;
    auVar18[3] = cVar30;
    auVar18[4] = cVar31;
    auVar18[5] = cVar32;
    auVar18[6] = cVar33;
    auVar18[7] = cVar34;
    auVar18[8] = cVar35;
    auVar18[9] = cVar36;
    auVar18[10] = cVar37;
    auVar18[0xb] = cVar38;
    auVar18[0xc] = bVar39;
    auVar16[1] = cVar29;
    auVar16[0] = cVar28;
    auVar16[2] = cVar30;
    auVar16[3] = cVar31;
    auVar16[4] = cVar32;
    auVar16[5] = cVar33;
    auVar16[6] = cVar34;
    auVar16[7] = cVar35;
    auVar16[8] = cVar36;
    auVar16[9] = cVar37;
    auVar16[10] = cVar38;
    auVar16[0xb] = bVar39;
    auVar14[1] = cVar30;
    auVar14[0] = cVar29;
    auVar14[2] = cVar31;
    auVar14[3] = cVar32;
    auVar14[4] = cVar33;
    auVar14[5] = cVar34;
    auVar14[6] = cVar35;
    auVar14[7] = cVar36;
    auVar14[8] = cVar37;
    auVar14[9] = cVar38;
    auVar14[10] = bVar39;
    uVar4 = (ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB141(auVar20 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar18 >> 7,0) & 1) << 3 |
            (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
            (ushort)((byte)(CONCAT19(bVar39,CONCAT18(cVar38,CONCAT17(cVar37,CONCAT16(cVar36,CONCAT15
                                                  (cVar35,CONCAT14(cVar34,CONCAT13(cVar33,CONCAT12(
                                                  cVar32,CONCAT11(cVar31,cVar30))))))))) >> 7) & 1)
            << 6 | (ushort)((byte)(CONCAT18(bVar39,CONCAT17(cVar38,CONCAT16(cVar37,CONCAT15(cVar36,
                                                  CONCAT14(cVar35,CONCAT13(cVar34,CONCAT12(cVar33,
                                                  CONCAT11(cVar32,cVar31)))))))) >> 7) & 1) << 7 |
            (ushort)(bVar39 >> 7) << 0xf;
  }
  __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x89c,
                "FindInfo phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::basic_string<char>>>::find_first_non_full(size_t) [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::basic_string<char>>]"
               );
}

Assistant:

FindInfo find_first_non_full(size_t hashval) {
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            auto mask = g.MatchEmptyOrDeleted();
            if (mask) {
                return {seq.offset((size_t)mask.LowestBitSet()), seq.getindex()};
            }
            assert(seq.getindex() < capacity_ && "full table!");
            seq.next();
        }
    }